

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O1

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::scaleImage
          (toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage,ktx_uint32_t width,
          ktx_uint32_t height)

{
  long *plVar1;
  long *plVar2;
  undefined4 in_register_00000014;
  long *plVar3;
  undefined4 in_R8D;
  stringstream message;
  long *local_1a0 [49];
  
  plVar3 = (long *)CONCAT44(in_register_00000014,width);
  (**(code **)(*(long *)*plVar3 + 0x88))
            (*(undefined4 *)
              &pImage[0x5b]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
               super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
               super__Head_base<0UL,_Image_*,_false>._M_head_impl,local_1a0,(long *)*plVar3,height,
             in_R8D,pImage[0x57]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t
                    .super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                    super__Head_base<0UL,_Image_*,_false>._M_head_impl,2);
  plVar2 = local_1a0[0];
  local_1a0[0] = (long *)0x0;
  plVar1 = (long *)*plVar3;
  *plVar3 = (long)plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  if (local_1a0[0] != (long *)0x0) {
    (**(code **)(*local_1a0[0] + 8))();
  }
  (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)*plVar3;
  *plVar3 = 0;
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

unique_ptr<Image>
toktxApp::scaleImage(unique_ptr<Image> pImage, ktx_uint32_t width, ktx_uint32_t height)
{
    try {
        pImage = pImage->resample(width, height,
                        options.gmopts.filter.c_str(),
                        options.gmopts.filterScale,
                        basisu::Resampler::Boundary_Op::BOUNDARY_CLAMP);
    } catch (runtime_error& e) {
        stringstream message;
        message << "Image::resample() failed! " << e.what();
        // A couple of the exceptions have to do with memory but the
        // others are "too large an image" and "unknown filter." The
        // latter are much more likely to occur hence choice of exception.
        throw cant_create_image(message.str());
    }
    return pImage;
}